

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O1

void __thiscall
FTraceInfo::EnterSectorPortal
          (FTraceInfo *this,FPathTraverse *pt,int position,double frac,sector_t_conflict *entersec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_ETraceStatus_FTraceResults_ptr_void_ptr *p_Var5;
  FTraceResults *pFVar6;
  subsector_t *psVar7;
  double x;
  double dVar8;
  double y;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar1 = sectorPortals.Array[entersec->Portals[position]].mDisplacement.X;
  dVar2 = sectorPortals.Array[entersec->Portals[position]].mDisplacement.Y;
  dVar8 = this->MaxDist * frac;
  dVar3 = (this->Start).X;
  dVar4 = (this->Start).Y;
  dVar9 = (this->Vec).X * dVar8 + dVar3;
  dVar10 = (this->Vec).Y * dVar8 + dVar4;
  dVar11 = (this->Vec).Z * dVar8 + (this->Start).Z;
  x = dVar1 + dVar9;
  y = dVar2 + dVar10;
  (this->Start).X = dVar1 + dVar3;
  (this->Start).Y = dVar2 + dVar4;
  psVar7 = P_PointInSubsector(x,y);
  this->CurSector = psVar7->sector;
  this->inshootthrough = 1;
  this->startfrac = frac;
  this->EnterDist = dVar8;
  FPathTraverse::PortalRelocate
            (pt,&sectorPortals.Array[entersec->Portals[position]].mDisplacement,this->ptflags,frac);
  if (((this->TraceFlags & 0x10) != 0) &&
     (p_Var5 = this->TraceCallback, p_Var5 != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0))
  {
    pFVar6 = this->Results;
    pFVar6->HitType = TRACE_CrossingPortal;
    (pFVar6->HitPos).Z = dVar11;
    (pFVar6->HitPos).Y = dVar10;
    (pFVar6->HitPos).X = dVar9;
    (pFVar6->SrcFromTarget).Z = dVar11;
    (pFVar6->SrcFromTarget).Y = y;
    (pFVar6->SrcFromTarget).X = x;
    (pFVar6->HitVector).Z = (this->Vec).Z;
    (pFVar6->HitVector).Y = (this->Vec).Y;
    (pFVar6->HitVector).X = (this->Vec).X;
    (*p_Var5)(pFVar6,this->TraceCallbackData);
  }
  Setup3DFloors(this);
  return;
}

Assistant:

void FTraceInfo::EnterSectorPortal(FPathTraverse &pt, int position, double frac, sector_t *entersec)
{
	DVector2 displacement = entersec->GetPortalDisplacement(position);;
	double enterdist = MaxDist * frac;
	DVector3 exit = Start + enterdist * Vec;
	DVector3 enter = exit + displacement;

	Start += displacement;
	CurSector = P_PointInSector(enter);
	inshootthrough = true;
	startfrac = frac;
	EnterDist = enterdist;
	pt.PortalRelocate(entersec->GetPortal(position)->mDisplacement, ptflags, frac);

	if ((TraceFlags & TRACE_ReportPortals) && TraceCallback != NULL)
	{
		enterdist = MaxDist * frac;
		Results->HitType = TRACE_CrossingPortal;
		Results->HitPos = exit;
		Results->SrcFromTarget = enter;
		Results->HitVector = Vec;
		TraceCallback(*Results, TraceCallbackData);
	}

	Setup3DFloors();
}